

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.capnp.h
# Opt level: O0

Builder * __thiscall
capnp::schema::Type::Builder::initAnyPointer(Builder *__return_storage_ptr__,Builder *this)

{
  StructBuilder base;
  uint uVar1;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::setDataField<capnp::schema::Type::Which>
            (&this->_builder,uVar1,ANY_POINTER);
  uVar1 = bounded<4u>();
  capnp::_::StructBuilder::setDataField<unsigned_short>(&this->_builder,uVar1,0);
  uVar1 = bounded<5u>();
  capnp::_::StructBuilder::setDataField<unsigned_short>(&this->_builder,uVar1,0);
  uVar1 = bounded<2u>();
  capnp::_::StructBuilder::setDataField<unsigned_long>(&this->_builder,uVar1,0);
  memcpy(&local_38,this,0x28);
  base.capTable = (CapTableBuilder *)uStack_30;
  base.segment = (SegmentBuilder *)local_38;
  base.data = (void *)local_28;
  base.pointers = (WirePointer *)uStack_20;
  base.dataSize = (undefined4)local_18;
  base.pointerCount = local_18._4_2_;
  base._38_2_ = local_18._6_2_;
  AnyPointer::Builder::Builder(__return_storage_ptr__,base);
  return __return_storage_ptr__;
}

Assistant:

inline typename Type::AnyPointer::Builder Type::Builder::initAnyPointer() {
  _builder.setDataField<Type::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Type::ANY_POINTER);
  _builder.setDataField< ::uint16_t>(::capnp::bounded<4>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField< ::uint16_t>(::capnp::bounded<5>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField< ::uint64_t>(::capnp::bounded<2>() * ::capnp::ELEMENTS, 0);
  return typename Type::AnyPointer::Builder(_builder);
}